

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

VOID PROCCleanupInitialProcess(void)

{
  CPalThread *pThread;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&g_csProcess);
  free(g_lpwstrAppDir);
  free(g_lpwstrCmdLine);
  CorUnix::InternalLeaveCriticalSection(pThread,&g_csProcess);
  return;
}

Assistant:

VOID
PROCCleanupInitialProcess(VOID)
{
    CPalThread *pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, &g_csProcess);

    /* Free the application directory */
    free(g_lpwstrAppDir);

    /* Free the stored command line */
    free(g_lpwstrCmdLine);

    InternalLeaveCriticalSection(pThread, &g_csProcess);

    //
    // Object manager shutdown will handle freeing the underlying
    // thread and process data
    //

}